

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::add<>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option)

{
  mapped_type *this_00;
  key_type local_20;
  SIMDReplaceOp local_1c;
  FeatureSet feature_local;
  SIMDReplaceOp option_local;
  
  local_20.features = feature.features;
  local_1c = option;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,&local_20);
  std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::push_back
            (this_00,&local_1c);
  return this;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }